

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O1

void Ptex::v2_2::(anonymous_namespace)::ApplyS<unsigned_short,4>
               (PtexTriangleKernelIter *k,float *result,void *data,int param_4,int nTxChan)

{
  float fVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong *puVar12;
  ushort uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  int local_48;
  
  iVar9 = k->v1;
  if (iVar9 != k->v2) {
    fVar1 = k->A;
    local_48 = -iVar9;
    do {
      iVar3 = k->rowlen;
      iVar4 = k->u1;
      iVar11 = (iVar3 - iVar9) - k->w2;
      if (iVar11 < iVar4) {
        iVar11 = iVar4;
      }
      iVar10 = (iVar3 - iVar9) - k->w1;
      if (k->u2 < iVar10) {
        iVar10 = k->u2;
      }
      iVar10 = (iVar10 - iVar11) * nTxChan;
      if (0 < iVar10) {
        fVar15 = (float)iVar11 - k->u;
        fVar14 = (float)iVar9 - k->v;
        fVar16 = fVar15 * k->A * fVar15 + (k->B * fVar15 + k->C * fVar14) * fVar14;
        fVar14 = (fVar15 + fVar15 + 1.0) * k->A + fVar14 * k->B;
        iVar8 = (iVar3 + local_48) - k->w2;
        if (iVar8 < iVar4) {
          iVar8 = iVar4;
        }
        puVar12 = (ulong *)((long)data + (long)((iVar8 + iVar3 * iVar9) * nTxChan) * 2);
        do {
          if (fVar16 < 1.0) {
            fVar15 = expf(fVar16 * -6.125);
            fVar15 = fVar15 * k->wscale;
            k->weight = k->weight + fVar15;
            uVar2 = *puVar12;
            uVar13 = (ushort)(uVar2 >> 0x30);
            auVar6._8_4_ = 0;
            auVar6._0_8_ = uVar2;
            auVar6._12_2_ = uVar13;
            auVar7._8_2_ = (short)(uVar2 >> 0x20);
            auVar7._0_8_ = uVar2;
            auVar7._10_4_ = auVar6._10_4_;
            auVar5._2_10_ = SUB1610(ZEXT616(auVar7._8_6_) << 0x40,6);
            auVar5._0_2_ = (short)(uVar2 >> 0x10);
            *result = fVar15 * (float)(ushort)uVar2 + *result;
            result[1] = fVar15 * (float)auVar5._0_4_ + result[1];
            result[2] = fVar15 * (float)auVar7._8_4_ + result[2];
            result[3] = fVar15 * (float)uVar13 + result[3];
          }
          fVar16 = fVar16 + fVar14;
          fVar14 = fVar14 + fVar1 + fVar1;
          puVar12 = (ulong *)((long)puVar12 + (long)nTxChan * 2);
        } while (puVar12 < (ulong *)((long)data +
                                    (long)iVar10 * 2 +
                                    (long)((iVar11 + iVar3 * iVar9) * nTxChan) * 2));
      }
      iVar9 = iVar9 + 1;
      local_48 = local_48 + -1;
    } while (iVar9 != k->v2);
  }
  return;
}

Assistant:

void ApplyS(PtexTriangleKernelIter& k, float* result, void* data, int /*nChan*/, int nTxChan)
    {
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccum<T,nChan>()(result, p, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }